

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  value_type *obj;
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  key_equal *eql;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_03;
  hasher hVar2;
  int i_2;
  TypeParam empty_ht;
  int i_1;
  TypeParam swap_to_clear_ht;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  int i;
  TypeParam other_ht;
  hasher hasher;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff4d8;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff4e0;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff4e8;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff4f0;
  key_equal *in_stack_fffffffffffff4f8;
  int iVar3;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff500;
  char *in_stack_fffffffffffff508;
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff510;
  value_type *in_stack_fffffffffffff558;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff560;
  int local_854;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_848;
  Hasher local_838;
  Hasher local_82c [17];
  int local_75c;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_758;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_750;
  Hasher local_740;
  Hasher local_734 [13];
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_690;
  key_equal *local_688;
  undefined4 local_67c;
  AssertionResult local_678 [2];
  key_type local_658;
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_650;
  undefined4 local_644;
  AssertionResult local_640 [2];
  size_type local_620;
  undefined4 local_614;
  AssertionResult local_610 [2];
  size_type local_5f0;
  undefined4 local_5e4;
  AssertionResult local_5e0 [2];
  value_type *local_5c0;
  int local_5b8;
  value_type *local_5b0;
  int local_5a8;
  int local_5a0;
  undefined4 local_59c;
  AssertionResult local_598 [2];
  hasher local_578;
  hasher local_568;
  int local_558;
  undefined4 local_554;
  AssertionResult local_550 [2];
  key_type local_530;
  key_type local_528;
  AssertionResult local_520 [2];
  key_type local_500;
  key_type local_4f8;
  AssertionResult local_4f0 [2];
  key_type local_4d0;
  size_type local_4c8;
  undefined4 local_4bc;
  AssertionResult local_4b8 [2];
  key_type local_498;
  size_type local_490;
  undefined4 local_484;
  AssertionResult local_480 [2];
  key_type local_460;
  size_type local_458;
  undefined4 local_44c;
  AssertionResult local_448 [2];
  key_type local_428;
  size_type local_420;
  undefined4 local_414;
  AssertionResult local_410 [2];
  key_type local_3f0;
  size_type local_3e8;
  undefined4 local_3dc;
  AssertionResult local_3d8 [2];
  key_type local_3b8;
  size_type local_3b0;
  undefined4 local_3a4;
  AssertionResult local_3a0 [2];
  size_type local_380;
  undefined4 local_374;
  AssertionResult local_370 [2];
  size_type local_350;
  undefined4 local_344;
  AssertionResult local_340 [2];
  undefined4 local_31c;
  size_type local_318;
  AssertionResult local_310 [2];
  size_type local_2f0;
  AssertionResult local_2e8 [2];
  key_equal local_2c8;
  key_equal local_2b8;
  int local_2a8;
  undefined4 local_2a4;
  AssertionResult local_2a0 [2];
  key_equal local_280;
  key_equal local_270;
  int local_260;
  undefined4 local_25c;
  AssertionResult local_258 [2];
  hasher local_238;
  hasher local_228;
  int local_218;
  undefined4 local_214;
  AssertionResult local_210 [2];
  hasher local_1f0;
  hasher local_1e0;
  int local_1d0;
  undefined4 local_1cc;
  AssertionResult local_1c8 [2];
  key_type local_1a8;
  key_type local_1a0;
  AssertionResult local_198 [2];
  key_type local_178;
  key_type local_170;
  AssertionResult local_168;
  size_type local_158;
  key_type local_118;
  int local_d4;
  key_type local_d0;
  key_type local_c8;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_b0 [9];
  Hasher local_14;
  
  Hasher::Hasher(&local_14,1);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(local_b0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff510,(size_type)in_stack_fffffffffffff508,
             (hasher *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
             (allocator_type *)in_stack_fffffffffffff4f0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(local_b0);
  local_c8 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  local_d0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  for (local_d4 = 3; local_d4 < 2000; local_d4 = local_d4 + 1) {
    HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffff4e8,(int)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xc04110);
  }
  local_118 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff4e8,(int)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xc04222);
  local_158 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc0422f);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  local_170 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  local_178 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc042a1);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (char **)in_stack_fffffffffffff4e8,(char **)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc04342);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc043a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc04416);
  local_1a0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  local_1a8 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc0444f);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (char **)in_stack_fffffffffffff4e8,(char **)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc044dc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0453f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc045b0);
  local_1cc = 1;
  local_1f0 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_fffffffffffff4f0);
  local_1e0 = local_1f0;
  local_1d0 = Hasher::id(&local_1e0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc046a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc04703);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc04774);
  local_214 = 0;
  local_238 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_fffffffffffff4f0);
  local_228 = local_238;
  local_218 = Hasher::id(&local_228);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_210);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc04860);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc048c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc04934);
  local_25c = 1;
  local_280 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_fffffffffffff4f0);
  local_270 = local_280;
  local_260 = Hasher::id(&local_270);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_258);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc04a24);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc04a87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc04af8);
  local_2a4 = 0;
  local_2c8 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_fffffffffffff4f0);
  local_2b8 = local_2c8;
  local_2a8 = Hasher::id(&local_2b8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc04be4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc04c47);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc04cb5);
  local_2f0 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc04cc6);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (unsigned_long *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc04d53);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc04db6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc04e27);
  local_318 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc04e34);
  local_31c = 200;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (unsigned_long *)in_stack_fffffffffffff4e8,(uint *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc04ecc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc04f2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc04fa0);
  local_344 = 1;
  local_350 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc04fbc);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_340);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc05049);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc050ac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0511d);
  local_374 = 0x7cc;
  local_380 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc05135);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc051c2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc05225);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc05296);
  local_3a4 = 0;
  local_3b8 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  local_3b0 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0537e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc053e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc05452);
  local_3dc = 1;
  local_3f0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  local_3e8 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0552b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0558e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc055ff);
  local_414 = 1;
  local_428 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  local_420 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_410);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc056e7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0574a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc057bb);
  local_44c = 0;
  local_460 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  local_458 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc05894);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc058f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc05968);
  local_484 = 0;
  local_498 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  local_490 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_480);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc05a50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc05ab3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc05b24);
  local_4bc = 0;
  local_4d0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  local_4c8 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc05bfd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc05c60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc05cd1);
  google::
  swap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff4e0,
             (HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff4d8);
  local_4f8 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  local_500 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc05d29);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (char **)in_stack_fffffffffffff4e8,(char **)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc05db6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc05e19);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc05e8a);
  local_528 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  local_530 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc05ec3);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (char **)in_stack_fffffffffffff4e8,(char **)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_520);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc05f50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc05fb3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc06024);
  local_554 = 0;
  local_578 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_fffffffffffff4f0);
  local_568 = local_578;
  local_558 = Hasher::id(&local_568);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_550);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    in_stack_fffffffffffff560 =
         (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc06114);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc06177);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc061e8);
  local_59c = 1;
  hVar2 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::hash_funct(in_stack_fffffffffffff4f0);
  local_5b8 = hVar2.num_compares_;
  obj = hVar2._0_8_;
  local_5c0 = obj;
  local_5b0 = obj;
  local_5a8 = local_5b8;
  local_5a0 = Hasher::id((Hasher *)&local_5b0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_598);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc062ce);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0632b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0639c);
  local_5e4 = 0x7cc;
  local_5f0 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc063b8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0643f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0649c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0650a);
  local_614 = 1;
  local_620 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc06522);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_610);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc065a9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,
               (Type)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc06606);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc06677);
  local_644 = 1;
  local_658 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20))
  ;
  this_00 = (HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)google::
               BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  local_650 = this_00;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  iVar3 = (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_640);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff508 =
         testing::AssertionResult::failure_message((AssertionResult *)0xc0674d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)in_stack_fffffffffffff508 >> 0x20),
               (char *)in_stack_fffffffffffff500,iVar3,(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc067aa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0681b);
  local_67c = 0;
  this_01 = (HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffff500,iVar3);
  local_690 = this_01;
  eql = (key_equal *)
        google::
        BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        ::count(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  local_688 = eql;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)eql,(char *)in_stack_fffffffffffff4f0,(uint *)in_stack_fffffffffffff4e8,
             (unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_678);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff4f0 =
         (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc068e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)in_stack_fffffffffffff508 >> 0x20),
               (char *)this_01,(int)((ulong)eql >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff560,(Message *)obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc06945);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc069b6);
  Hasher::Hasher(local_734,0);
  Hasher::Hasher(&local_740,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_750,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (this_00,(size_type)in_stack_fffffffffffff508,(hasher *)this_01,eql,
             (allocator_type *)in_stack_fffffffffffff4f0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_750);
  this_02 = (HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_01,(int)((ulong)eql >> 0x20));
  local_758 = this_02;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff4e0,(key_type *)in_stack_fffffffffffff4d8);
  for (local_75c = 2; local_75c < 10000; local_75c = local_75c + 1) {
    HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(this_02,(int)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff560,obj);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xc06ac6);
  }
  Hasher::Hasher(local_82c,0);
  Hasher::Hasher(&local_838,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_848,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (this_00,(size_type)in_stack_fffffffffffff508,(hasher *)this_01,eql,
             (allocator_type *)in_stack_fffffffffffff4f0);
  iVar3 = (int)((ulong)eql >> 0x20);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_848);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  this_03 = (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_01,iVar3);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(this_03,(key_type *)in_stack_fffffffffffff4d8);
  for (local_854 = 2; local_854 < 10000; local_854 = local_854 + 1) {
    HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(this_02,(int)((ulong)this_03 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff560,obj);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xc06c77);
  }
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xc06cf3);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xc06d00);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xc06d0d);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}